

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O2

void createVars(vec<BoolView> *x,int n)

{
  BoolView *pBVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  vec<BoolView>::growTo(x,n);
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    iVar2 = SAT::newVar(&sat,1,(ChannelInfo)0x0);
    pBVar1 = x->data;
    *(int *)((long)&pBVar1->v + uVar4) = iVar2;
    (&pBVar1->s)[uVar4] = false;
  }
  return;
}

Assistant:

void createVars(vec<BoolView>& x, int n) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i] = newBoolVar();
	}
}